

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

QSslConfiguration __thiscall QSslSocket::sslConfiguration(QSslSocket *this)

{
  long lVar1;
  _Head_base<0UL,_QSslCipherPrivate_*,_false> _Var2;
  SslProtocol SVar3;
  QSslConfigurationPrivate *this_00;
  long in_RSI;
  long in_FS_OFFSET;
  _Head_base<0UL,_QSslCipherPrivate_*,_false> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(in_RSI + 8);
  this_00 = (QSslConfigurationPrivate *)operator_new(0x140);
  QSslConfigurationPrivate::QSslConfigurationPrivate
            (this_00,(QSslConfigurationPrivate *)(lVar1 + 0x298));
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i = 0;
  if (*(long **)(lVar1 + 0x408) == (long *)0x0) {
    QSslCipher::QSslCipher((QSslCipher *)&local_28);
  }
  else {
    (**(code **)(**(long **)(lVar1 + 0x408) + 0xb8))(&local_28);
  }
  _Var2._M_head_impl =
       (this_00->sessionCipher).d._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  (this_00->sessionCipher).d._M_t.
  super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = _Var2._M_head_impl;
  QSslCipher::~QSslCipher((QSslCipher *)&local_28);
  if (*(long **)(lVar1 + 0x408) == (long *)0x0) {
    SVar3 = UnknownProtocol;
  }
  else {
    SVar3 = (**(code **)(**(long **)(lVar1 + 0x408) + 0xc0))();
  }
  this_00->sessionProtocol = SVar3;
  *(QSslConfigurationPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket = this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QSharedDataPointer<QSslConfigurationPrivate>)
           (QSharedDataPointer<QSslConfigurationPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QSslConfiguration QSslSocket::sslConfiguration() const
{
    Q_D(const QSslSocket);

    // create a deep copy of our configuration
    QSslConfigurationPrivate *copy = new QSslConfigurationPrivate(d->configuration);
    copy->ref.storeRelaxed(0);              // the QSslConfiguration constructor refs up
    copy->sessionCipher = d->sessionCipher();
    copy->sessionProtocol = d->sessionProtocol();

    return QSslConfiguration(copy);
}